

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_service_handler.c
# Opt level: O0

void csp_service_handler(csp_packet_t *packet)

{
  int iVar1;
  uint uVar2;
  __uint32_t _Var3;
  uint32_t uVar4;
  void *packet_00;
  csp_packet_t *in_RDI;
  uint32_t time;
  uint32_t size;
  uint32_t magic_word;
  uint32_t total;
  __uint32_t in_stack_ffffffffffffffe8;
  __uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  __uint32_t in_stack_fffffffffffffff4;
  
  packet_00 = (void *)(ulong)(in_RDI->id).dport;
  switch(packet_00) {
  case (void *)0x0:
    iVar1 = csp_cmp_handler((csp_packet_t *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 != 0) {
      csp_buffer_free(packet_00);
      return;
    }
    break;
  case (void *)0x1:
    break;
  case (void *)0x2:
    uVar2 = csp_ps_hook(in_RDI);
    in_RDI->length = (uint16_t)uVar2;
    if (in_RDI->length == 0) {
      csp_buffer_free(packet_00);
    }
    break;
  case (void *)0x3:
    uVar4 = csp_memfree_hook();
    in_stack_fffffffffffffff4 = __bswap_32(uVar4);
    (in_RDI->field_5).data32[0] = in_stack_fffffffffffffff4;
    in_RDI->length = 4;
    break;
  case (void *)0x4:
    _Var3 = __bswap_32((in_RDI->field_5).data32[0]);
    if (_Var3 == 0x80078007) {
      csp_reboot_hook();
    }
    else if (_Var3 == 0xd1e5529a) {
      csp_shutdown_hook();
    }
    csp_buffer_free(packet_00);
    return;
  case (void *)0x5:
    _Var3 = csp_buffer_remaining();
    in_stack_ffffffffffffffec = __bswap_32(_Var3);
    (in_RDI->field_5).data32[0] = in_stack_ffffffffffffffec;
    in_RDI->length = 4;
    break;
  case (void *)0x6:
    uVar4 = csp_get_s();
    in_stack_ffffffffffffffe8 = __bswap_32(uVar4);
    (in_RDI->field_5).data32[0] = in_stack_ffffffffffffffe8;
    in_RDI->length = 4;
    break;
  default:
    csp_buffer_free(packet_00);
    return;
  }
  if (in_RDI != (csp_packet_t *)0x0) {
    csp_sendto_reply((csp_packet_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (csp_packet_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (uint32_t)((ulong)packet_00 >> 0x20));
  }
  return;
}

Assistant:

void csp_service_handler(csp_packet_t * packet) {

	switch (packet->id.dport) {

		case CSP_CMP:
			/* Pass to CMP handler */
			if (csp_cmp_handler(packet) != CSP_ERR_NONE) {
				csp_buffer_free(packet);
				return;
			}
			break;

		case CSP_PING:
			/* A ping means, just echo the packet, so no changes */
			break;

		case CSP_PS: {
			packet->length = csp_ps_hook(packet);
			if (packet->length == 0) {
				csp_buffer_free(packet);
			}
			break;
		}

		case CSP_MEMFREE: {

			uint32_t total = 0;
			total = csp_memfree_hook();
			
			total = htobe32(total);
			memcpy(packet->data, &total, sizeof(total));
			packet->length = sizeof(total);

			break;
		}

		case CSP_REBOOT: {
			uint32_t magic_word;
			memcpy(&magic_word, packet->data, sizeof(magic_word));

			magic_word = be32toh(magic_word);

			/* If the magic word is valid, reboot */
			if (magic_word == CSP_REBOOT_MAGIC) {
				csp_reboot_hook();
			} else if (magic_word == CSP_REBOOT_SHUTDOWN_MAGIC) {
				csp_shutdown_hook();
			}

			csp_buffer_free(packet);
			return;
		}

		case CSP_BUF_FREE: {
			uint32_t size = csp_buffer_remaining();
			size = htobe32(size);
			memcpy(packet->data, &size, sizeof(size));
			packet->length = sizeof(size);
			break;
		}

		case CSP_UPTIME: {
			uint32_t time = csp_get_s();
			time = htobe32(time);
			memcpy(packet->data, &time, sizeof(time));
			packet->length = sizeof(time);
			break;
		}

		default:
			csp_buffer_free(packet);
			return;
	}

	if (packet != NULL) {
		csp_sendto_reply(packet, packet, CSP_O_SAME);
	}
}